

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

int pztopology::TPZTetrahedron::NumSides(int dimension)

{
  int in_EDI;
  int local_4;
  
  if ((in_EDI < 0) || (3 < in_EDI)) {
    std::operator<<((ostream *)&std::cerr,"TPZTetrahedron::NumSides. Bad parameter i.\n");
    local_4 = 0;
  }
  else if (in_EDI == 0) {
    local_4 = 4;
  }
  else if (in_EDI == 1) {
    local_4 = 6;
  }
  else if (in_EDI == 2) {
    local_4 = 4;
  }
  else if (in_EDI == 3) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZTetrahedron::NumSides(int dimension) {		if(dimension<0 || dimension> 3) {
		PZError << "TPZTetrahedron::NumSides. Bad parameter i.\n";
		return 0;
	}
		if(dimension==0) return 4;
		if(dimension==1) return 6;
		if(dimension==2) return 4;
		if(dimension==3) return 1;
		return -1;
	}